

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O1

void __thiscall xray_re::xr_light_object::save_v12(xr_light_object *this,xr_ini_writer *w)

{
  pointer pcVar1;
  size_t sVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  char *__buf_06;
  void *__buf_07;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  pcVar1 = (this->m_animation)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (this->m_animation)._M_string_length);
  sVar2 = 0;
  xr_ini_writer::write(w,0x1f1ae3,(string *)local_40,0);
  __buf = extraout_RDX;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
    __buf = extraout_RDX_00;
  }
  xr_ini_writer::write(w,0x1f1af1,__buf,sVar2);
  xr_ini_writer::write(w,0x1f1afe,__buf_00,sVar2);
  xr_ini_writer::write(w,0x1f1b0b,__buf_01,sVar2);
  xr_ini_writer::write(w,0x1f1b18,__buf_02,sVar2);
  xr_ini_writer::write(w,0x1f2a44,__buf_03,sVar2);
  xr_ini_writer::write(w,0x1f1b23,__buf_04,sVar2);
  pcVar1 = (this->m_texture)._M_dataplus._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + (this->m_texture)._M_string_length);
  sVar2 = 0;
  xr_ini_writer::write(w,0x1f1b28,(string *)local_60,0);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  xr_ini_writer::write(w,0x1f1b37,(void *)(ulong)this->m_control,sVar2);
  xr_ini_writer::write(w,0x1f1b45,(void *)(ulong)this->m_flags,sVar2);
  xr_ini_writer::write(w,0x1f1b51,__buf_05,sVar2);
  xr_ini_writer::write
            (w,0x1f274f,(void *)(ulong)*(uint *)&(this->super_xr_custom_object).field_0x6c,sVar2);
  __buf_06 = "on";
  if (this->m_use_in_d3d == 0) {
    __buf_06 = "off";
  }
  sVar2 = 1;
  xr_ini_writer::write(w,0x1f1b57,__buf_06,1);
  xr_ini_writer::write(w,0x1f3d25,(void *)0x11,sVar2);
  xr_ini_writer::write(w,0x1f1b62,__buf_07,sVar2);
  return;
}

Assistant:

void xr_light_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("anim_ref_name", this->m_animation, false);

	w->write("attenuation0", this->m_attenuation_constant);
	w->write("attenuation1", this->m_attenuation_linear);
	w->write("attenuation2", this->m_attenuation_quadratic);
	w->write("brightness", this->m_brightness);
	w->write("color", this->m_color);
	w->write("cone", this->m_cone_angle);

	w->write("fallof_texture", this->m_texture, false);

	w->write("light_control", this->m_control);
	w->write("light_flags", this->m_flags);
	w->write("range", this->m_range);
	w->write("type", this->m_type);
	w->write("use_in_d3d", this->m_use_in_d3d ? "on" : "off");
	w->write("version", LIGHT_VERSION);
	w->write("virtual_size", 0.0f);
}